

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall QtMWidgets::AbstractScrollArea::wheelEvent(AbstractScrollArea *this,QWheelEvent *e)

{
  QTimer *pQVar1;
  bool bVar2;
  KeyboardModifiers KVar3;
  int iVar4;
  AbstractScrollAreaPrivate *pAVar5;
  socklen_t *in_RCX;
  sockaddr *__addr;
  QPoint local_28;
  QPoint numDegrees;
  QPoint numPixels;
  QWheelEvent *e_local;
  AbstractScrollArea *this_local;
  
  numDegrees = QWheelEvent::pixelDelta(e);
  local_28 = QWheelEvent::angleDelta(e);
  pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::stopAnimatingBlurEffect(pAVar5);
  bVar2 = QPoint::isNull(&numDegrees);
  if (bVar2) {
    bVar2 = QPoint::isNull(&local_28);
    if (!bVar2) {
      KVar3 = QInputEvent::modifiers((QInputEvent *)e);
      bVar2 = ::operator==((QFlags<Qt::KeyboardModifier>)KVar3.i,ShiftModifier);
      if (bVar2) {
        pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
                 ::operator->(&this->d);
        iVar4 = QPoint::y(&local_28);
        AbstractScrollAreaPrivate::scrollContentsBy(pAVar5,iVar4 / 8,0);
        iVar4 = QPoint::y(&local_28);
        in_RCX = (socklen_t *)0x8;
        (**(code **)(*(long *)this + 0x1b0))(this,(long)iVar4 / 8 & 0xffffffff,0);
      }
      else {
        pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
                 ::operator->(&this->d);
        iVar4 = QPoint::y(&local_28);
        AbstractScrollAreaPrivate::scrollContentsBy(pAVar5,0,iVar4 / 8);
        iVar4 = QPoint::y(&local_28);
        in_RCX = (socklen_t *)0x8;
        (**(code **)(*(long *)this + 0x1b0))(this,0,(long)iVar4 / 8 & 0xffffffff);
      }
    }
  }
  else {
    KVar3 = QInputEvent::modifiers((QInputEvent *)e);
    bVar2 = ::operator==((QFlags<Qt::KeyboardModifier>)KVar3.i,ShiftModifier);
    if (bVar2) {
      pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
               ::operator->(&this->d);
      iVar4 = QPoint::y(&numDegrees);
      AbstractScrollAreaPrivate::scrollContentsBy(pAVar5,iVar4,0);
      iVar4 = QPoint::y(&numDegrees);
      (**(code **)(*(long *)this + 0x1b0))(this,iVar4,0);
    }
    else {
      pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
               ::operator->(&this->d);
      iVar4 = QPoint::y(&numDegrees);
      AbstractScrollAreaPrivate::scrollContentsBy(pAVar5,0,iVar4);
      iVar4 = QPoint::y(&numDegrees);
      (**(code **)(*(long *)this + 0x1b0))(this,0,iVar4);
    }
  }
  pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  if ((pAVar5->horIndicator->policy == ScrollIndicatorAsNeeded) ||
     (pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
               ::operator->(&this->d), pAVar5->vertIndicator->policy == ScrollIndicatorAsNeeded)) {
    pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    AbstractScrollAreaPrivate::animateScrollIndicators(pAVar5);
  }
  QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
  ::operator->(&this->d);
  QTimer::stop();
  pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  pQVar1 = pAVar5->startBlurAnimTimer;
  pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  iVar4 = pAVar5->animationTimeout;
  QTimer::start((int)pQVar1);
  QEvent::accept((QEvent *)e,iVar4,__addr,in_RCX);
  return;
}

Assistant:

void
AbstractScrollArea::wheelEvent( QWheelEvent * e )
{
	QPoint numPixels = e->pixelDelta();
	QPoint numDegrees = e->angleDelta();

	d->stopAnimatingBlurEffect();

	if( !numPixels.isNull() )
	{
		if( e->modifiers() == Qt::ShiftModifier )
		{
			d->scrollContentsBy( numPixels.y(), 0 );
			scrollContentsBy( numPixels.y(), 0 );
		}
		else
		{
			d->scrollContentsBy( 0, numPixels.y() );
			scrollContentsBy( 0, numPixels.y() );
		}
	}
	else if( !numDegrees.isNull() )
	{
		if( e->modifiers() == Qt::ShiftModifier )
		{
			d->scrollContentsBy( numDegrees.y() / 8, 0 );
			scrollContentsBy( numDegrees.y() / 8, 0 );
		}
		else
		{
			d->scrollContentsBy( 0, numDegrees.y() / 8 );
			scrollContentsBy( 0, numDegrees.y() / 8 );
		}
	}

	if( d->horIndicator->policy == ScrollIndicatorAsNeeded ||
		d->vertIndicator->policy == ScrollIndicatorAsNeeded )
			d->animateScrollIndicators();

	d->startBlurAnimTimer->stop();
	d->startBlurAnimTimer->start( d->animationTimeout );

	e->accept();
}